

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestReMaxCol(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int p_col,int len)

{
  int *piVar1;
  Dring *pDVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  pointer pnVar5;
  type_conflict5 tVar6;
  int iVar7;
  long lVar8;
  cpp_dec_float<200U,_int,_void> *v;
  int iVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *this_00;
  long lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  long local_140;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    iVar9 = len - (this->u).col.max[p_col];
    iVar7 = (this->u).col.used;
    if ((this->u).col.size - iVar7 < iVar9) {
      forestPackColumns(this);
      iVar9 = len - (this->u).col.max[p_col];
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      local_138.data._M_elems._0_8_ = SEXT48((this->u).col.used);
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&local_b8,&(this->colMemMult).m_backend,(longlong *)&local_138);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_140 = (long)len;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&local_138,&local_b8,&local_140);
      tVar6 = boost::multiprecision::operator<
                        (&(this->u).col.size,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_138);
      iVar7 = (this->u).col.used;
      if (tVar6) {
        local_138.data._M_elems._0_8_ = SEXT48(iVar7);
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 0x1c;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems[6] = 0;
        local_b8.data._M_elems[7] = 0;
        local_b8.data._M_elems[8] = 0;
        local_b8.data._M_elems[9] = 0;
        local_b8.data._M_elems[10] = 0;
        local_b8.data._M_elems[0xb] = 0;
        local_b8.data._M_elems[0xc] = 0;
        local_b8.data._M_elems[0xd] = 0;
        local_b8.data._M_elems[0xe] = 0;
        local_b8.data._M_elems[0xf] = 0;
        local_b8.data._M_elems[0x18] = 0;
        local_b8.data._M_elems[0x19] = 0;
        local_b8.data._M_elems._104_5_ = 0;
        local_b8.data._M_elems[0x1b]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        local_b8.data._M_elems[0x10] = 0;
        local_b8.data._M_elems[0x11] = 0;
        local_b8.data._M_elems[0x12] = 0;
        local_b8.data._M_elems[0x13] = 0;
        local_b8.data._M_elems[0x14] = 0;
        local_b8.data._M_elems[0x15] = 0;
        local_b8.data._M_elems[0x16] = 0;
        local_b8.data._M_elems[0x17] = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&local_b8,&(this->colMemMult).m_backend,(longlong *)&local_138);
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_140 = (long)len;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&local_138,&local_b8,&local_140);
        iVar7 = boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_138);
        forestMinColMem(this,iVar7);
        iVar7 = (this->u).col.used;
      }
    }
    (this->u).col.used = iVar7 + iVar9;
    (this->u).col.max[p_col] = len;
  }
  else {
    iVar7 = (this->u).col.used;
    if ((this->u).col.size - iVar7 < len) {
      forestPackColumns(this);
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      local_138.data._M_elems._0_8_ = SEXT48((this->u).col.used);
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&local_b8,&(this->colMemMult).m_backend,(longlong *)&local_138);
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_140 = (long)len;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&local_138,&local_b8,&local_140);
      tVar6 = boost::multiprecision::operator<
                        (&(this->u).col.size,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_138);
      iVar7 = (this->u).col.used;
      if (tVar6) {
        local_138.data._M_elems._0_8_ = SEXT48(iVar7);
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 0x1c;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems[6] = 0;
        local_b8.data._M_elems[7] = 0;
        local_b8.data._M_elems[8] = 0;
        local_b8.data._M_elems[9] = 0;
        local_b8.data._M_elems[10] = 0;
        local_b8.data._M_elems[0xb] = 0;
        local_b8.data._M_elems[0xc] = 0;
        local_b8.data._M_elems[0xd] = 0;
        local_b8.data._M_elems[0xe] = 0;
        local_b8.data._M_elems[0xf] = 0;
        local_b8.data._M_elems[0x18] = 0;
        local_b8.data._M_elems[0x19] = 0;
        local_b8.data._M_elems._104_5_ = 0;
        local_b8.data._M_elems[0x1b]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        local_b8.data._M_elems[0x10] = 0;
        local_b8.data._M_elems[0x11] = 0;
        local_b8.data._M_elems[0x12] = 0;
        local_b8.data._M_elems[0x13] = 0;
        local_b8.data._M_elems[0x14] = 0;
        local_b8.data._M_elems[0x15] = 0;
        local_b8.data._M_elems[0x16] = 0;
        local_b8.data._M_elems[0x17] = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&local_b8,&(this->colMemMult).m_backend,(longlong *)&local_138);
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_140 = (long)len;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  (&local_138,&local_b8,&local_140);
        iVar7 = boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_138);
        forestMinColMem(this,iVar7);
        iVar7 = (this->u).col.used;
      }
    }
    piVar1 = (this->u).col.start;
    lVar11 = (long)piVar1[p_col];
    lVar8 = (this->u).col.len[p_col] + lVar11;
    piVar1[p_col] = iVar7;
    piVar1 = &(this->u).col.used;
    *piVar1 = *piVar1 + len;
    pDVar2 = (this->u).col.elem;
    piVar1 = (this->u).col.max;
    pDVar3 = pDVar2[p_col].prev;
    piVar1[pDVar3->idx] = piVar1[pDVar3->idx] + piVar1[p_col];
    piVar1[p_col] = len;
    pDVar4 = pDVar2[p_col].next;
    pDVar4->prev = pDVar3;
    pDVar3->next = pDVar4;
    pDVar3 = (this->u).col.list.prev;
    pDVar4 = pDVar3->next;
    pDVar2[p_col].next = pDVar4;
    pDVar4->prev = pDVar2 + p_col;
    pDVar2[p_col].prev = pDVar3;
    pDVar3->next = pDVar2 + p_col;
    piVar1 = (this->u).col.idx;
    pnVar5 = (this->u).col.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)iVar7;
    v = &pnVar5[lVar11].m_backend;
    this_00 = &pnVar5[lVar10].m_backend;
    for (; lVar11 < lVar8; lVar11 = lVar11 + 1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,v);
      piVar1[lVar10] = piVar1[lVar11];
      lVar10 = lVar10 + 1;
      v = v + 1;
      this_00 = this_00 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::forestReMaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         forestPackColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            forestMinColMem(int(colMemMult * u.col.used + len));
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      R* val;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         forestPackColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            forestMinColMem(int(colMemMult * u.col.used + len));
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;
      val = u.col.val.data();

      for(; i < k; ++i)
      {
         val[j] = val[i];
         idx[j++] = idx[i];
      }
   }
}